

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraphFlattener::SceneGraphFlattener
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *in,InstancingMode instancing)

{
  undefined8 uVar1;
  pointer pRVar2;
  _Base_ptr p_Var3;
  GroupNode *this_00;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_3;
  size_t i_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v_1;
  size_t i_8;
  size_t i_7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced_1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v_2;
  size_t i_13;
  size_t i_12;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_2;
  size_t i_11;
  size_t i_10;
  size_t new_size_alloced_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v_3;
  size_t i_18;
  size_t i_17;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_3;
  size_t i_16;
  size_t i_15;
  size_t new_size_alloced_3;
  size_t i_4;
  size_t i_9;
  size_t i_14;
  size_t i_19;
  void *in_stack_ffffffffffffe948;
  Transformations *in_stack_ffffffffffffe950;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffe958;
  GroupNode *this_01;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffe9f8;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffea00;
  SceneGraphFlattener *in_stack_ffffffffffffea08;
  undefined4 local_14f8;
  undefined4 local_14f4;
  Ref<embree::SceneGraph::Node> RStack_14f0;
  Transformations *local_14e8;
  undefined8 local_14e0;
  void *local_14d8;
  undefined1 local_14d0;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined1 auStack_14b8 [8];
  ulong local_14b0;
  undefined8 local_14a8;
  void *local_14a0;
  undefined1 local_1498;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined1 auStack_1480 [8];
  ulong local_1478;
  undefined8 local_1470;
  void *local_1468;
  undefined1 local_1460;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined1 auStack_1448 [8];
  ulong local_1440;
  undefined8 local_1438;
  void *local_1430;
  undefined1 local_1428;
  int local_13f4;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffec80;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffec88;
  SceneGraphFlattener *in_stack_ffffffffffffec90;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  Ref<embree::SceneGraph::Node> *pRStack_1330;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *local_1328;
  SceneGraphFlattener *pSStack_1320;
  undefined8 *local_1318;
  undefined1 *local_1310;
  undefined8 *local_1308;
  undefined8 *local_1300;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  **local_12f8;
  undefined8 *local_12f0;
  undefined8 *local_12e8;
  undefined8 *local_12e0;
  undefined1 *local_12d8;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  **local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  long local_12b8;
  undefined8 local_12a0;
  ulong local_1298;
  undefined1 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 *local_1278;
  undefined8 *local_1270;
  undefined8 local_1250;
  undefined1 *local_1248;
  undefined8 local_1240;
  undefined8 *local_1238;
  undefined8 *local_1230;
  undefined8 *local_1228;
  undefined8 *local_1220;
  undefined8 *local_1218;
  undefined8 *local_1210;
  undefined8 *local_1208;
  undefined8 *local_1200;
  undefined8 *local_11f8;
  undefined8 *local_11f0;
  undefined8 *local_11e8;
  undefined8 *local_11e0;
  undefined8 *local_11d8;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  **local_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 *local_1178;
  undefined8 *local_1170;
  undefined8 *local_1168;
  undefined8 *local_1160;
  undefined8 *local_1158;
  undefined8 *local_1150;
  undefined8 *local_1148;
  undefined8 *local_1140;
  undefined8 *local_1138;
  undefined8 *local_1130;
  undefined8 *local_1128;
  undefined8 *local_1120;
  undefined8 *local_1118;
  undefined8 *local_1110;
  undefined8 *local_1108;
  void *local_1100;
  void *local_10f8;
  long local_10f0;
  long local_10e8;
  void *local_10e0;
  long local_10d8;
  undefined8 local_10a0;
  undefined1 *local_1098;
  undefined8 local_1090;
  long local_1088;
  undefined1 *local_1080;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined4 local_1028;
  undefined4 local_1024;
  undefined4 *local_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 *local_fd8;
  undefined1 *local_fd0;
  undefined8 *local_fc8;
  undefined8 *local_fc0;
  undefined8 *local_fb8;
  undefined8 *local_fb0;
  undefined8 *local_fa8;
  undefined8 *local_fa0;
  undefined8 *local_f98;
  undefined8 *local_f90;
  ulong local_f88;
  ulong local_f80;
  long local_f78;
  undefined8 local_f60;
  ulong local_f58;
  undefined1 *local_f50;
  undefined8 *local_f48;
  undefined8 *local_f40;
  undefined8 *local_f38;
  undefined8 *local_f30;
  undefined8 local_f10;
  undefined1 *local_f08;
  undefined8 local_f00;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  undefined8 *local_ee0;
  undefined8 *local_ed8;
  undefined8 *local_ed0;
  undefined8 *local_ec8;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 *local_ea8;
  undefined8 *local_ea0;
  undefined8 *local_e98;
  undefined8 *local_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  undefined8 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  undefined8 *local_e50;
  undefined8 *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined8 *local_e08;
  undefined8 *local_e00;
  undefined8 *local_df8;
  undefined8 *local_df0;
  undefined8 *local_de8;
  undefined8 *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  void *local_dc0;
  void *local_db8;
  long local_db0;
  long local_da8;
  void *local_da0;
  long local_d98;
  undefined8 local_d60;
  undefined1 *local_d58;
  Transformations *in_stack_fffffffffffff2b0;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffff2b8;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffff2c0;
  SceneGraphFlattener *in_stack_fffffffffffff2c8;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 *local_c98;
  undefined1 *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  ulong local_c48;
  ulong local_c40;
  long local_c38;
  undefined8 local_c20;
  ulong local_c18;
  undefined1 *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 local_bd0;
  undefined1 *local_bc8;
  undefined8 local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  void *local_a80;
  void *local_a78;
  long local_a70;
  long local_a68;
  void *local_a60;
  long local_a58;
  undefined8 local_a20;
  undefined1 *local_a18;
  undefined8 local_a10;
  long local_a08;
  undefined1 *local_a00;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 *local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  Ref<embree::SceneGraph::Node> *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  Transformations *local_900;
  Transformations *local_8f8;
  long local_8f0;
  undefined8 local_8d8;
  Transformations *in_stack_fffffffffffff730;
  Transformations *spaces;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffff738;
  Ref<embree::SceneGraph::Node> *node;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffff740;
  SceneGraphFlattener *in_stack_fffffffffffff748;
  Transformations *in_stack_fffffffffffffb18;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffb20;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  
  *in_RDI = 0;
  local_13f4 = in_EDX;
  std::
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::map((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
         *)0x1eb8ae);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x1eb8c7);
  (**(code **)(*(long *)*in_RSI + 0x30))();
  (**(code **)(*(long *)*in_RSI + 0x38))
            ((long *)*in_RSI,local_13f4 == 2,extraout_RDX,local_13f4 == 2);
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            *)0x1eb950);
  if (local_13f4 == 0) {
    local_ce0 = &local_14c0;
    local_c98 = &local_d28;
    local_c60 = &local_cd8;
    local_b80 = &local_cc8;
    local_b88 = &local_cb8;
    local_b50 = &local_ca8;
    local_ae0 = &local_d18;
    local_ad8 = &local_cc8;
    local_af0 = &local_d08;
    local_ae8 = &local_cb8;
    local_c58 = &local_cf8;
    local_c50 = &local_ca8;
    local_c18 = 0;
    uStack_cf0 = 0x3f80000000000000;
    local_cf8 = 0;
    uStack_ca0 = 0x3f80000000000000;
    local_ca8 = 0;
    uStack_cb0 = 0x3f800000;
    local_cb8 = 0;
    uStack_cc0 = 0;
    local_cc8 = 0x3f80000000000000;
    uStack_cd0 = 0;
    local_cd8 = 0x3f800000;
    uStack_d00 = 0x3f800000;
    local_d08 = 0;
    uStack_d10 = 0;
    local_d18 = 0x3f80000000000000;
    uStack_d20 = 0;
    local_d28 = 0x3f800000;
    local_1498 = 0;
    local_14a0 = (void *)0x0;
    local_14a8 = 0;
    local_14bc = 0x3f800000;
    local_14c0 = 0;
    local_bc0 = 1;
    local_bd0 = 1;
    local_ce4 = 0;
    local_ce8 = 0x3f800000;
    local_c20 = 1;
    local_14b0 = 0;
    local_c38 = 0;
    local_a20 = 1;
    local_c90 = auStack_14b8;
    local_c68 = local_c98;
    local_c10 = auStack_14b8;
    local_bc8 = auStack_14b8;
    local_bb0 = local_c60;
    local_b78 = local_c60;
    local_b00 = local_c98;
    local_af8 = local_c60;
    local_ad0 = local_c98;
    local_ac8 = local_c60;
    local_a18 = auStack_14b8;
    local_14a0 = alignedMalloc((size_t)in_stack_ffffffffffffe958,(size_t)in_stack_ffffffffffffe950);
    for (local_c40 = 0; local_c40 < local_14b0; local_c40 = local_c40 + 1) {
      local_c00 = (undefined8 *)((long)local_14a0 + local_c40 * 0x40);
      local_c08 = (undefined8 *)(local_c38 + local_c40 * 0x40);
      local_b68 = local_c00 + 2;
      local_b70 = local_c00 + 4;
      local_b58 = local_c00 + 6;
      uVar1 = local_c08[1];
      *local_c00 = *local_c08;
      local_c00[1] = uVar1;
      local_b20 = local_c08 + 2;
      local_b18 = local_c00 + 2;
      uVar1 = local_c08[3];
      *local_b18 = *local_b20;
      local_c00[3] = uVar1;
      local_b30 = local_c08 + 4;
      local_b28 = local_c00 + 4;
      uVar1 = local_c08[5];
      *local_b28 = *local_b30;
      local_c00[5] = uVar1;
      local_bf8 = local_c08 + 6;
      local_bf0 = local_c00 + 6;
      uVar1 = local_c08[7];
      *local_bf0 = *local_bf8;
      local_c00[7] = uVar1;
      local_bb8 = local_c00;
      local_b60 = local_c00;
      local_b40 = local_c08;
      local_b38 = local_c00;
      local_b10 = local_c08;
      local_b08 = local_c00;
    }
    for (local_c48 = local_14b0; local_c48 < local_c18; local_c48 = local_c48 + 1) {
      local_a80 = (void *)((long)local_14a0 + local_c48 * 0x40);
      local_a68 = (long)local_a80 + 0x10;
      local_a70 = (long)local_a80 + 0x20;
      local_a58 = (long)local_a80 + 0x30;
      local_a78 = local_a80;
      local_a60 = local_a80;
    }
    local_a10 = local_14a8;
    local_a08 = local_c38;
    local_a00 = auStack_14b8;
    alignedFree(in_stack_ffffffffffffe948);
    local_14a8 = local_c20;
    local_14b0 = local_c18 + 1;
    local_c80 = (undefined8 *)((long)local_14a0 + local_c18 * 0x40);
    local_c88 = &local_cd8;
    local_b98 = local_c80 + 2;
    local_ba0 = local_c80 + 4;
    local_b48 = local_c80 + 6;
    *local_c80 = local_cd8;
    local_c80[1] = uStack_cd0;
    local_aa0 = &local_cc8;
    local_a98 = local_c80 + 2;
    *local_a98 = local_cc8;
    local_c80[3] = uStack_cc0;
    local_ab0 = &local_cb8;
    local_aa8 = local_c80 + 4;
    *local_aa8 = local_cb8;
    local_c80[5] = uStack_cb0;
    local_c78 = &local_ca8;
    local_c70 = local_c80 + 6;
    *local_c70 = local_ca8;
    local_c80[7] = uStack_ca0;
    local_ba8 = local_c80;
    local_b90 = local_c80;
    local_ac0 = local_c88;
    local_ab8 = local_c80;
    local_a90 = local_c88;
    local_a88 = local_c80;
    convertGeometries((SceneGraphFlattener *)
                      CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                      in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)
    ;
    SceneGraph::Transformations::~Transformations(in_stack_ffffffffffffe950);
    local_9a0 = &local_14f8;
    local_948 = &RStack_14f0;
    local_950 = &local_9e8;
    local_918 = &local_998;
    local_910 = &local_9b8;
    local_908 = &local_968;
    spaces = (Transformations *)0x0;
    uStack_960 = 0x3f80000000000000;
    local_968 = 0;
    uStack_970 = 0x3f800000;
    local_978 = 0;
    uStack_980 = 0;
    local_988 = 0x3f80000000000000;
    uStack_990 = 0;
    local_998 = 0x3f800000;
    uStack_9b0 = 0x3f80000000000000;
    local_9b8 = 0;
    uStack_9c0 = 0x3f800000;
    local_9c8 = 0;
    uStack_9d0 = 0;
    local_9d8 = 0x3f80000000000000;
    uStack_9e0 = 0;
    local_9e8 = 0x3f800000;
    local_14d0 = 0;
    local_14d8 = (void *)0x0;
    local_14e0 = 0;
    local_14f4 = 0x3f800000;
    local_14f8 = 0;
    local_9a4 = 0;
    local_9a8 = 0x3f800000;
    local_8d8 = 1;
    local_14e8 = (Transformations *)0x0;
    local_8f0 = 0;
    local_920 = local_950;
    node = local_948;
    local_14d8 = alignedMalloc((size_t)in_stack_ffffffffffffe958,(size_t)in_stack_ffffffffffffe950);
    for (local_8f8 = (Transformations *)0x0; local_8f8 < local_14e8;
        local_8f8 = (Transformations *)((long)&(local_8f8->time_range).lower + 1)) {
      in_stack_fffffffffffff748 = (SceneGraphFlattener *)((long)local_14d8 + (long)local_8f8 * 0x40)
      ;
      in_stack_fffffffffffff740 =
           (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            *)(local_8f0 + (long)local_8f8 * 0x40);
      pRVar2 = (in_stack_fffffffffffff740->
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (in_stack_fffffffffffff748->node).ptr =
           (Node *)(in_stack_fffffffffffff740->
                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&(in_stack_fffffffffffff748->object_mapping)._M_t._M_impl = pRVar2;
      p_Var3 = (_Base_ptr)
               in_stack_fffffffffffff740[1].
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       &(in_stack_fffffffffffff748->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header =
           (in_stack_fffffffffffff740->
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (in_stack_fffffffffffff748->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = p_Var3;
      p_Var3 = (_Base_ptr)
               in_stack_fffffffffffff740[1].
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (in_stack_fffffffffffff748->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)
                in_stack_fffffffffffff740[1].
                super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (in_stack_fffffffffffff748->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = p_Var3;
      pRVar2 = in_stack_fffffffffffff740[2].
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (in_stack_fffffffffffff748->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)in_stack_fffffffffffff740[2].
                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&(in_stack_fffffffffffff748->unique_id)._M_t._M_impl = pRVar2;
    }
    for (local_900 = local_14e8; local_900 < spaces;
        local_900 = (Transformations *)((long)&(local_900->time_range).lower + 1)) {
    }
    alignedFree(in_stack_ffffffffffffe948);
    local_14e0 = local_8d8;
    local_14e8 = (Transformations *)((long)&(spaces->time_range).lower + 1);
    local_938 = (undefined8 *)((long)local_14d8 + (long)spaces * 0x40);
    local_940 = &local_998;
    *local_938 = local_998;
    local_938[1] = uStack_990;
    local_938[2] = local_988;
    local_938[3] = uStack_980;
    local_938[4] = local_978;
    local_938[5] = uStack_970;
    local_930 = &local_968;
    local_928 = local_938 + 6;
    *local_928 = local_968;
    local_938[7] = uStack_960;
    convertLightsAndCameras(in_stack_fffffffffffff748,in_stack_fffffffffffff740,node,spaces);
    SceneGraph::Transformations::~Transformations(in_stack_ffffffffffffe950);
  }
  else {
    if (local_13f4 == 3) {
      convertFlattenedInstances
                (in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
    }
    else if (local_13f4 == 4) {
      convertMultiLevelInstances
                (in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,in_stack_ffffffffffffec80);
    }
    else {
      local_1318 = &local_13a8;
      local_12e0 = &local_1358;
      local_1200 = &local_1348;
      local_1208 = &local_1338;
      local_11d0 = &local_1328;
      local_1160 = &local_1398;
      local_1158 = &local_1348;
      local_1170 = &local_1388;
      local_1168 = &local_1338;
      local_12d8 = &stack0xffffffffffffec88;
      local_12d0 = &local_1328;
      local_1298 = 0;
      local_1338 = 0;
      uStack_1340 = 0;
      local_1348 = 0x3f80000000000000;
      uStack_1350 = 0;
      local_1358 = 0x3f800000;
      local_1388 = 0;
      uStack_1390 = 0;
      local_1398 = 0x3f80000000000000;
      uStack_13a0 = 0;
      local_13a8 = 0x3f800000;
      local_1428 = 0;
      local_1430 = (void *)0x0;
      local_1438 = 0;
      local_144c = 0x3f800000;
      local_1450 = 0;
      local_1240 = 1;
      local_1250 = 1;
      local_12a0 = 1;
      local_1440 = 0;
      local_12b8 = 0;
      local_10a0 = 1;
      local_1310 = auStack_1448;
      local_12e8 = local_1318;
      local_1290 = auStack_1448;
      local_1248 = auStack_1448;
      local_1230 = local_12e0;
      local_11f8 = local_12e0;
      local_1180 = local_1318;
      local_1178 = local_12e0;
      local_1150 = local_1318;
      local_1148 = local_12e0;
      local_1098 = auStack_1448;
      pRStack_1330 = in_stack_ffffffffffffec80;
      local_1328 = in_stack_ffffffffffffec88;
      pSStack_1320 = in_stack_ffffffffffffec90;
      local_1430 = alignedMalloc((size_t)in_stack_ffffffffffffe958,(size_t)in_stack_ffffffffffffe950
                                );
      for (local_12c0 = 0; local_12c0 < local_1440; local_12c0 = local_12c0 + 1) {
        local_1280 = (undefined8 *)((long)local_1430 + local_12c0 * 0x40);
        local_1288 = (undefined8 *)(local_12b8 + local_12c0 * 0x40);
        local_11e8 = local_1280 + 2;
        local_11f0 = local_1280 + 4;
        local_11d8 = local_1280 + 6;
        uVar1 = local_1288[1];
        *local_1280 = *local_1288;
        local_1280[1] = uVar1;
        local_11a0 = local_1288 + 2;
        local_1198 = local_1280 + 2;
        uVar1 = local_1288[3];
        *local_1198 = *local_11a0;
        local_1280[3] = uVar1;
        local_11b0 = local_1288 + 4;
        local_11a8 = local_1280 + 4;
        uVar1 = local_1288[5];
        *local_11a8 = *local_11b0;
        local_1280[5] = uVar1;
        local_1278 = local_1288 + 6;
        local_1270 = local_1280 + 6;
        uVar1 = local_1288[7];
        *local_1270 = *local_1278;
        local_1280[7] = uVar1;
        local_1238 = local_1280;
        local_11e0 = local_1280;
        local_11c0 = local_1288;
        local_11b8 = local_1280;
        local_1190 = local_1288;
        local_1188 = local_1280;
      }
      for (local_12c8 = local_1440; local_12c8 < local_1298; local_12c8 = local_12c8 + 1) {
        local_1100 = (void *)((long)local_1430 + local_12c8 * 0x40);
        local_10e8 = (long)local_1100 + 0x10;
        local_10f0 = (long)local_1100 + 0x20;
        local_10d8 = (long)local_1100 + 0x30;
        local_10f8 = local_1100;
        local_10e0 = local_1100;
      }
      local_1090 = local_1438;
      local_1088 = local_12b8;
      local_1080 = auStack_1448;
      alignedFree(in_stack_ffffffffffffe948);
      local_1438 = local_12a0;
      local_1440 = local_1298 + 1;
      local_1300 = (undefined8 *)((long)local_1430 + local_1298 * 0x40);
      local_1308 = &local_1358;
      local_1218 = local_1300 + 2;
      local_1220 = local_1300 + 4;
      local_11c8 = local_1300 + 6;
      *local_1300 = local_1358;
      local_1300[1] = uStack_1350;
      local_1120 = &local_1348;
      local_1118 = local_1300 + 2;
      *local_1118 = local_1348;
      local_1300[3] = uStack_1340;
      local_1130 = &local_1338;
      local_1128 = local_1300 + 4;
      *local_1128 = local_1338;
      local_1300[5] = pRStack_1330;
      local_12f8 = &local_1328;
      local_12f0 = local_1300 + 6;
      *local_12f0 = local_1328;
      local_1300[7] = pSStack_1320;
      local_1228 = local_1300;
      local_1210 = local_1300;
      local_1140 = local_1308;
      local_1138 = local_1300;
      local_1110 = local_1308;
      local_1108 = local_1300;
      convertInstances(in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8
                       ,in_stack_fffffffffffff2b0);
      SceneGraph::Transformations::~Transformations(in_stack_ffffffffffffe950);
    }
    local_1020 = &local_1488;
    local_fd0 = auStack_1480;
    local_fd8 = &local_1068;
    local_fa0 = &local_1018;
    local_ec0 = &local_1008;
    local_ec8 = &local_ff8;
    local_e90 = &local_fe8;
    local_e20 = &local_1058;
    local_e18 = &local_1008;
    local_e30 = &local_1048;
    local_e28 = &local_ff8;
    local_f98 = &local_1038;
    local_f90 = &local_fe8;
    local_f58 = 0;
    uStack_fe0 = 0x3f80000000000000;
    local_fe8 = 0;
    uStack_ff0 = 0x3f800000;
    local_ff8 = 0;
    uStack_1000 = 0;
    local_1008 = 0x3f80000000000000;
    uStack_1010 = 0;
    local_1018 = 0x3f800000;
    uStack_1030 = 0x3f80000000000000;
    local_1038 = 0;
    uStack_1040 = 0x3f800000;
    local_1048 = 0;
    uStack_1050 = 0;
    local_1058 = 0x3f80000000000000;
    uStack_1060 = 0;
    local_1068 = 0x3f800000;
    local_1460 = 0;
    local_1468 = (void *)0x0;
    local_1470 = 0;
    local_1484 = 0x3f800000;
    local_1488 = 0;
    local_f00 = 1;
    local_f10 = 1;
    local_1024 = 0;
    local_1028 = 0x3f800000;
    local_f60 = 1;
    local_1478 = 0;
    local_f78 = 0;
    local_d60 = 1;
    local_fa8 = local_fd8;
    local_f50 = local_fd0;
    local_f08 = local_fd0;
    local_ef0 = local_fa0;
    local_eb8 = local_fa0;
    local_e40 = local_fd8;
    local_e38 = local_fa0;
    local_e10 = local_fd8;
    local_e08 = local_fa0;
    local_d58 = local_fd0;
    local_1468 = alignedMalloc((size_t)in_stack_ffffffffffffe958,(size_t)in_stack_ffffffffffffe950);
    for (local_f80 = 0; local_f80 < local_1478; local_f80 = local_f80 + 1) {
      local_f40 = (undefined8 *)((long)local_1468 + local_f80 * 0x40);
      local_f48 = (undefined8 *)(local_f78 + local_f80 * 0x40);
      local_ea8 = local_f40 + 2;
      local_eb0 = local_f40 + 4;
      local_e98 = local_f40 + 6;
      uVar1 = local_f48[1];
      *local_f40 = *local_f48;
      local_f40[1] = uVar1;
      local_e60 = local_f48 + 2;
      local_e58 = local_f40 + 2;
      uVar1 = local_f48[3];
      *local_e58 = *local_e60;
      local_f40[3] = uVar1;
      local_e70 = local_f48 + 4;
      local_e68 = local_f40 + 4;
      uVar1 = local_f48[5];
      *local_e68 = *local_e70;
      local_f40[5] = uVar1;
      local_f38 = local_f48 + 6;
      local_f30 = local_f40 + 6;
      uVar1 = local_f48[7];
      *local_f30 = *local_f38;
      local_f40[7] = uVar1;
      local_ef8 = local_f40;
      local_ea0 = local_f40;
      local_e80 = local_f48;
      local_e78 = local_f40;
      local_e50 = local_f48;
      local_e48 = local_f40;
    }
    for (local_f88 = local_1478; local_f88 < local_f58; local_f88 = local_f88 + 1) {
      local_dc0 = (void *)((long)local_1468 + local_f88 * 0x40);
      local_da8 = (long)local_dc0 + 0x10;
      local_db0 = (long)local_dc0 + 0x20;
      local_d98 = (long)local_dc0 + 0x30;
      local_db8 = local_dc0;
      local_da0 = local_dc0;
    }
    alignedFree(in_stack_ffffffffffffe948);
    local_1470 = local_f60;
    local_1478 = local_f58 + 1;
    local_fc0 = (undefined8 *)((long)local_1468 + local_f58 * 0x40);
    local_fc8 = &local_1018;
    local_ed8 = local_fc0 + 2;
    local_ee0 = local_fc0 + 4;
    local_e88 = local_fc0 + 6;
    *local_fc0 = local_1018;
    local_fc0[1] = uStack_1010;
    local_de0 = &local_1008;
    local_dd8 = local_fc0 + 2;
    *local_dd8 = local_1008;
    local_fc0[3] = uStack_1000;
    local_df0 = &local_ff8;
    local_de8 = local_fc0 + 4;
    *local_de8 = local_ff8;
    local_fc0[5] = uStack_ff0;
    local_fb8 = &local_fe8;
    local_fb0 = local_fc0 + 6;
    *local_fb0 = local_fe8;
    local_fc0[7] = uStack_fe0;
    local_ee8 = local_fc0;
    local_ed0 = local_fc0;
    local_e00 = local_fc8;
    local_df8 = local_fc0;
    local_dd0 = local_fc8;
    local_dc8 = local_fc0;
    convertLightsAndCameras
              (in_stack_fffffffffffff748,in_stack_fffffffffffff740,in_stack_fffffffffffff738,
               in_stack_fffffffffffff730);
    SceneGraph::Transformations::~Transformations(in_stack_ffffffffffffe950);
  }
  (**(code **)(*(long *)*in_RSI + 0x40))();
  this_00 = (GroupNode *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,in_stack_ffffffffffffe958);
  this_01 = this_00;
  if (this_00 != (GroupNode *)0x0) {
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  if (*in_RDI != 0) {
    (**(code **)(*(long *)*in_RDI + 0x18))();
  }
  *in_RDI = (long)this_00;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::~vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             *)this_01);
  return;
}

Assistant:

SceneGraphFlattener (Ref<SceneGraph::Node> in, SceneGraph::InstancingMode instancing)
    {
      in->calculateInDegree();
      in->calculateClosed(instancing == SceneGraph::INSTANCING_GROUP);

      std::vector<Ref<SceneGraph::Node>> geometries;      
      if (instancing != SceneGraph::INSTANCING_NONE) 
      {
        if      (instancing == SceneGraph::INSTANCING_FLATTENED  ) convertFlattenedInstances(geometries,in);
        else if (instancing == SceneGraph::INSTANCING_MULTI_LEVEL) convertMultiLevelInstances(geometries,in);
        else                                                       convertInstances(geometries,in,one);
        convertLightsAndCameras(geometries,in,one);
      }
      else
      {
        convertGeometries(geometries,in,one);
        convertLightsAndCameras(geometries,in,one);
      }
      in->resetInDegree();
      
      node = new SceneGraph::GroupNode(geometries);
    }